

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2min_distance_targets.cc
# Opt level: O0

bool __thiscall
S2MinDistanceCellTarget::UpdateMinDistance
          (S2MinDistanceCellTarget *this,S2Point *p,S2MinDistance *min_dist)

{
  bool bVar1;
  S1ChordAngle x;
  S2MinDistance local_28;
  S2MinDistance *local_20;
  S2MinDistance *min_dist_local;
  S2Point *p_local;
  S2MinDistanceCellTarget *this_local;
  
  local_20 = min_dist;
  min_dist_local = (S2MinDistance *)p;
  p_local = (S2Point *)this;
  x = S2Cell::GetDistance(&this->cell_,p);
  S2MinDistance::S2MinDistance(&local_28,x);
  bVar1 = S2MinDistance::UpdateMin(min_dist,&local_28);
  return bVar1;
}

Assistant:

bool S2MinDistanceCellTarget::UpdateMinDistance(const S2Point& p,
                                                S2MinDistance* min_dist) {
  return min_dist->UpdateMin(S2MinDistance(cell_.GetDistance(p)));
}